

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pembase64.c
# Opt level: O0

int ptls_get_pem_object(FILE *F,char *label,ptls_buffer_t *buf)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  undefined1 local_138 [8];
  ptls_base64_decode_state_t state;
  char line [256];
  int ret;
  ptls_buffer_t *buf_local;
  char *label_local;
  FILE *F_local;
  
  line[0xfc] = '3';
  line[0xfd] = '\x02';
  line[0xfe] = '\0';
  line[0xff] = '\0';
  do {
    pcVar3 = fgets((char *)&state.status,0x100,(FILE *)F);
    if (pcVar3 == (char *)0x0) goto LAB_00139f9e;
    iVar1 = ptls_compare_separator_line((char *)&state.status,"BEGIN",label);
  } while (iVar1 != 0);
  line[0xfc] = '\0';
  line[0xfd] = '\0';
  line[0xfe] = '\0';
  line[0xff] = '\0';
  ptls_base64_decode_init((ptls_base64_decode_state_t *)local_138);
LAB_00139f9e:
  while( true ) {
    bVar4 = false;
    if (line._252_4_ == 0) {
      pcVar3 = fgets((char *)&state.status,0x100,(FILE *)F);
      bVar4 = pcVar3 != (char *)0x0;
    }
    if (!bVar4) break;
    iVar1 = ptls_compare_separator_line((char *)&state.status,"END",label);
    if (iVar1 == 0) {
      if ((state.nbc == 0) || ((state.nbc == 1 && (local_138._0_4_ == 0)))) {
        line[0xfc] = '\0';
        line[0xfd] = '\0';
        line[0xfe] = '\0';
        line[0xff] = '\0';
      }
      else {
        line[0xfc] = '2';
        line[0xfd] = '\x02';
        line[0xfe] = '\0';
        line[0xff] = '\0';
      }
      iVar2._0_1_ = line[0xfc];
      iVar2._1_1_ = line[0xfd];
      iVar2._2_1_ = line[0xfe];
      iVar2._3_1_ = line[0xff];
      return iVar2;
    }
    line._252_4_ = ptls_base64_decode((char *)&state.status,(ptls_base64_decode_state_t *)local_138,
                                      buf);
  }
  iVar1._0_1_ = line[0xfc];
  iVar1._1_1_ = line[0xfd];
  iVar1._2_1_ = line[0xfe];
  iVar1._3_1_ = line[0xff];
  return iVar1;
}

Assistant:

static int ptls_get_pem_object(FILE *F, const char *label, ptls_buffer_t *buf)
{
    int ret = PTLS_ERROR_PEM_LABEL_NOT_FOUND;
    char line[256];
    ptls_base64_decode_state_t state;

    /* Get the label on a line by itself */
    while (fgets(line, 256, F)) {
        if (ptls_compare_separator_line(line, "BEGIN", label) == 0) {
            ret = 0;
            ptls_base64_decode_init(&state);
            break;
        }
    }
    /* Get the data in the buffer */
    while (ret == 0 && fgets(line, 256, F)) {
        if (ptls_compare_separator_line(line, "END", label) == 0) {
            if (state.status == PTLS_BASE64_DECODE_DONE || (state.status == PTLS_BASE64_DECODE_IN_PROGRESS && state.nbc == 0)) {
                ret = 0;
            } else {
                ret = PTLS_ERROR_INCORRECT_BASE64;
            }
            break;
        } else {
            ret = ptls_base64_decode(line, &state, buf);
        }
    }

    return ret;
}